

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_input.hpp
# Opt level: O2

variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *
get_input(variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
         int argc,char **argv)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  ifstream file;
  int aiStack_208 [122];
  
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"usage ");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1," path-to-input");
    std::endl<char,std::char_traits<char>>(poVar1);
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>).
      super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
      super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
      super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
      super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
      super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_u = 0;
    (__return_storage_ptr__->
    super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>).
    super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
    super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
    super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
    super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
    super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_index = '\0';
  }
  else {
    __s = argv[1];
    sVar2 = strlen(__s);
    std::ifstream::ifstream(&file,__s,_S_in);
    if (*(int *)((long)aiStack_208 + *(long *)(_file + -0x18)) == 0) {
      std::__detail::__variant::_Variant_storage<false,int,std::ifstream>::
      _Variant_storage<1ul,std::ifstream>
                ((_Variant_storage<false,int,std::ifstream> *)__return_storage_ptr__,&file);
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Couldn\'t read ");
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
      std::endl<char,std::char_traits<char>>(poVar1);
      *(undefined4 *)
       &(__return_storage_ptr__->
        super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>).
        super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_u = 1;
      (__return_storage_ptr__->
      super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>).
      super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
      super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
      super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
      super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
      super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_index = '\0';
    }
    std::ifstream::~ifstream(&file);
  }
  return __return_storage_ptr__;
}

Assistant:

std::variant<int, std::ifstream> get_input(int argc, char* argv[]) {
  if (argc < 2) {
    std::cout << "usage " << argv[0] << " path-to-input" << std::endl;
    return 0;
  }

  std::string_view path = argv[1];

  auto file = std::ifstream{path.begin()};

  if (!file.good()) {
    std::cerr << "Couldn't read " << path << std::endl;
    return 1;
  }

  return file;
}